

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapequad.cpp
# Opt level: O3

void pzshape::TPZShapeQuad::ShapeInternal
               (TPZVec<double> *x,int order,TPZFMatrix<double> *phi,TPZFMatrix<double> *dphi)

{
  long lVar1;
  int i;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  long lVar5;
  long lVar6;
  int j;
  ulong uVar7;
  int64_t size;
  TPZFNMatrix<20,_double> phi0;
  TPZFMatrix<double> local_510;
  double local_480 [21];
  TPZFMatrix<double> local_3d8;
  double local_348 [21];
  TPZFMatrix<double> local_2a0;
  double local_210 [21];
  TPZFMatrix<double> local_168;
  double local_d8 [21];
  
  if (1 < order) {
    uVar4 = order - 1;
    uVar3 = (ulong)(uVar4 * uVar4);
    if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < (long)uVar3) ||
       ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
      (*(phi->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xd])
                (phi,uVar3,1);
    }
    if (((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 2) ||
       ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < (long)uVar3)) {
      (*(dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xd])
                (dphi,2,uVar3);
    }
    uVar3 = (ulong)uVar4;
    local_3d8.fElem = local_348;
    local_3d8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 1;
    local_3d8.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
    local_3d8.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
    local_3d8.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFMatrix_01816bf8;
    local_3d8.fSize = 0x14;
    local_3d8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = uVar3;
    local_3d8.fGiven = local_3d8.fElem;
    TPZVec<int>::TPZVec(&local_3d8.fPivot.super_TPZVec<int>,0);
    local_3d8.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
    local_3d8.fPivot.super_TPZVec<int>.fStore = local_3d8.fPivot.fExtAlloc;
    local_3d8.fPivot.super_TPZVec<int>.fNElements = 0;
    local_3d8.fPivot.super_TPZVec<int>.fNAlloc = 0;
    local_3d8.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
    local_3d8.fWork.fStore = (double *)0x0;
    local_3d8.fWork.fNElements = 0;
    local_3d8.fWork.fNAlloc = 0;
    if (0x14 < uVar4) {
      local_3d8.fElem = (double *)operator_new__(uVar3 * 8);
    }
    local_3d8.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFNMatrix_01816908;
    local_510.fElem = local_480;
    local_510.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 1;
    local_510.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
    local_510.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
    local_510.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFMatrix_01816bf8;
    local_510.fSize = 0x14;
    local_510.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = uVar3;
    local_510.fGiven = local_510.fElem;
    TPZVec<int>::TPZVec(&local_510.fPivot.super_TPZVec<int>,0);
    local_510.fPivot.super_TPZVec<int>.fStore = local_510.fPivot.fExtAlloc;
    local_510.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
    local_510.fPivot.super_TPZVec<int>.fNElements = 0;
    local_510.fPivot.super_TPZVec<int>.fNAlloc = 0;
    local_510.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
    local_510.fWork.fStore = (double *)0x0;
    local_510.fWork.fNElements = 0;
    local_510.fWork.fNAlloc = 0;
    if (0x14 < uVar4) {
      local_510.fElem = (double *)operator_new__(uVar3 * 8);
    }
    local_510.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFNMatrix_01816908;
    local_168.fElem = local_d8;
    local_168.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 1;
    local_168.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
    local_168.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
    local_168.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFMatrix_01816bf8;
    local_168.fSize = 0x14;
    local_168.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = uVar3;
    local_168.fGiven = local_168.fElem;
    TPZVec<int>::TPZVec(&local_168.fPivot.super_TPZVec<int>,0);
    local_168.fPivot.super_TPZVec<int>.fStore = local_168.fPivot.fExtAlloc;
    local_168.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
    local_168.fPivot.super_TPZVec<int>.fNElements = 0;
    local_168.fPivot.super_TPZVec<int>.fNAlloc = 0;
    local_168.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
    local_168.fWork.fStore = (double *)0x0;
    local_168.fWork.fNElements = 0;
    local_168.fWork.fNAlloc = 0;
    if (0x14 < uVar4) {
      local_168.fElem = (double *)operator_new__(uVar3 * 8);
    }
    local_168.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFNMatrix_01816908;
    local_2a0.fElem = local_210;
    local_2a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 1;
    local_2a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
    local_2a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
    local_2a0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFMatrix_01816bf8;
    local_2a0.fSize = 0x14;
    local_2a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = uVar3;
    local_2a0.fGiven = local_2a0.fElem;
    TPZVec<int>::TPZVec(&local_2a0.fPivot.super_TPZVec<int>,0);
    local_2a0.fPivot.super_TPZVec<int>.fStore = local_2a0.fPivot.fExtAlloc;
    local_2a0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
    local_2a0.fPivot.super_TPZVec<int>.fNElements = 0;
    local_2a0.fPivot.super_TPZVec<int>.fNAlloc = 0;
    local_2a0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
    local_2a0.fWork.fStore = (double *)0x0;
    local_2a0.fWork.fNElements = 0;
    local_2a0.fWork.fNAlloc = 0;
    if (0x14 < uVar4) {
      local_2a0.fElem = (double *)operator_new__(uVar3 * 8);
    }
    local_2a0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFNMatrix_01816908;
    (*(code *)TPZShapeLinear::fOrthogonal)(*x->fStore,uVar4,&local_3d8,&local_168);
    (*(code *)TPZShapeLinear::fOrthogonal)(x->fStore[1],uVar4,&local_510,&local_2a0);
    lVar6 = 0;
    uVar2 = 0;
    do {
      uVar7 = 0;
      lVar5 = lVar6;
      do {
        if ((local_3d8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)uVar2) ||
           (local_3d8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        if ((local_510.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)uVar7) ||
           (local_510.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar5) ||
           ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        phi->fElem[lVar5] = local_3d8.fElem[uVar2] * local_510.fElem[uVar7];
        if ((local_168.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 1) ||
           (local_168.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= (long)uVar2)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        if ((local_510.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)uVar7) ||
           (local_510.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        lVar1 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
        if ((lVar1 < 1) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar5)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        dphi->fElem[lVar1 * lVar5] =
             local_168.fElem[local_168.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * uVar2] *
             local_510.fElem[uVar7];
        if ((local_3d8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)uVar2) ||
           (local_3d8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        if ((local_2a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 1) ||
           (local_2a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= (long)uVar7)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        lVar1 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
        if ((lVar1 < 2) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar5)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        dphi->fElem[lVar1 * lVar5 + 1] =
             local_3d8.fElem[uVar2] *
             local_2a0.fElem[local_2a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * uVar7];
        uVar7 = uVar7 + 1;
        lVar5 = lVar5 + 1;
      } while (uVar3 != uVar7);
      uVar2 = uVar2 + 1;
      lVar6 = lVar6 + uVar3;
    } while (uVar2 != uVar3);
    TPZFMatrix<double>::~TPZFMatrix(&local_2a0,&PTR_PTR_01816bc0);
    TPZFMatrix<double>::~TPZFMatrix(&local_168,&PTR_PTR_01816bc0);
    TPZFMatrix<double>::~TPZFMatrix(&local_510,&PTR_PTR_01816bc0);
    TPZFMatrix<double>::~TPZFMatrix(&local_3d8,&PTR_PTR_01816bc0);
  }
  return;
}

Assistant:

void TPZShapeQuad::ShapeInternal(TPZVec<REAL> &x, int order,
                                     TPZFMatrix<REAL> &phi, TPZFMatrix<REAL> &dphi) {
        
        if((order-2) < 0) return;
        int ord1 = order - 1;
        int numshape = (order-1)*(order-1);
        if(numshape > phi.Rows() || phi.Cols() < 1) phi.Resize(numshape,1);
        if(dphi.Rows() < 2 || dphi.Cols() < numshape) dphi.Resize(2,numshape);
        TPZFNMatrix<20, REAL> phi0(ord1,1),phi1(ord1,1),dphi0(1,ord1),dphi1(1,ord1);
        TPZShapeLinear::fOrthogonal(x[0],ord1,phi0,dphi0);
        TPZShapeLinear::fOrthogonal(x[1],ord1,phi1,dphi1);
        for (int i=0;i<ord1;i++) {
            for (int j=0;j<ord1;j++) {
                int index = i*ord1+j;
                phi(index,0) =  phi0(i,0)* phi1(j,0);
                dphi(0,index) = dphi0(0,i)* phi1(j,0);
                dphi(1,index) =  phi0(i,0)*dphi1(0,j);
            }
        }
      
    }